

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_radio.c
# Opt level: O0

void radio_dialog(t_radio *x,t_symbol *s,int argc,t_atom *argv)

{
  _glist *canvas;
  bool bVar1;
  int iVar2;
  t_symbol *s_00;
  t_float tVar3;
  t_float tVar4;
  int local_18c;
  undefined1 local_188 [8];
  t_atom undo [18];
  int redraw;
  int sr_flags;
  int num;
  int chg;
  int a;
  t_symbol *srl [3];
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_radio *x_local;
  
  tVar3 = atom_getfloatarg(0,argc,argv);
  tVar4 = atom_getfloatarg(4,argc,argv);
  sr_flags = (int)tVar4;
  tVar4 = atom_getfloatarg(6,argc,argv);
  bVar1 = false;
  iemgui_setdialogatoms(&x->x_gui,0x12,(t_atom *)local_188);
  undo[0].a_w.w_float = 1.4013e-45;
  undo[1].a_type = A_NULL;
  undo[1].a_w.w_float = 1.4013e-45;
  undo[2].a_type = A_NULL;
  undo[2].a_w.w_float = 1.4013e-45;
  undo[3].a_type = A_NULL;
  undo[3].a_w.w_float = 1.4013e-45;
  if (x->x_compat == 0) {
    local_18c = -1;
  }
  else {
    local_18c = x->x_change;
  }
  undo[4].a_type = (t_atomtype)(float)local_18c;
  undo[5].a_w.w_float = 1.4013e-45;
  undo[6].a_type = (t_atomtype)(float)x->x_number;
  canvas = (x->x_gui).x_glist;
  s_00 = gensym("dialog");
  pd_undo_set_objectstate(canvas,(t_pd *)x,s_00,0x12,(t_atom *)local_188,argc,argv);
  if (sr_flags != 0) {
    sr_flags = 1;
  }
  x->x_change = sr_flags;
  iemgui_dialog(&x->x_gui,(t_symbol **)&chg,argc,argv);
  iVar2 = iemgui_clip_size((int)tVar3);
  (x->x_gui).x_w = iVar2 * ((x->x_gui).x_glist)->gl_zoom;
  (x->x_gui).x_h = (x->x_gui).x_w;
  if (((int)tVar4 != x->x_number) && (iVar2 = glist_isvisible((x->x_gui).x_glist), iVar2 != 0)) {
    (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,4);
    bVar1 = true;
  }
  x->x_number = (int)tVar4;
  if (x->x_number <= x->x_on) {
    iVar2 = x->x_number + -1;
    x->x_on = iVar2;
    x->x_on_old = iVar2;
    x->x_on_old = x->x_on;
  }
  if ((bVar1) && (iVar2 = gobj_shouldvis((t_gobj *)x,(x->x_gui).x_glist), iVar2 != 0)) {
    (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,2);
    canvas_fixlinesfor((x->x_gui).x_glist,(t_text *)x);
    return;
  }
  iemgui_size(x,&x->x_gui);
  return;
}

Assistant:

static void radio_dialog(t_radio *x, t_symbol *s, int argc, t_atom *argv)
{
    t_symbol *srl[3];
    int a = (int)atom_getfloatarg(0, argc, argv);
    int chg = (int)atom_getfloatarg(4, argc, argv);
    int num = (int)atom_getfloatarg(6, argc, argv);
    int sr_flags;
    int redraw = 0;
    t_atom undo[18];
    iemgui_setdialogatoms(&x->x_gui, 18, undo);
    SETFLOAT(undo+1, 0);
    SETFLOAT(undo+2, 0);
    SETFLOAT(undo+3, 0);
    SETFLOAT(undo+4, (x->x_compat)?x->x_change:-1);
    SETFLOAT(undo+6, x->x_number);

    pd_undo_set_objectstate(x->x_gui.x_glist, (t_pd*)x, gensym("dialog"),
                            18, undo,
                            argc, argv);

    if(chg != 0) chg = 1;
    x->x_change = chg;
    sr_flags = iemgui_dialog(&x->x_gui, srl, argc, argv);
    x->x_gui.x_w = iemgui_clip_size(a) * IEMGUI_ZOOM(x);
    x->x_gui.x_h = x->x_gui.x_w;
    if (num != x->x_number && glist_isvisible(x->x_gui.x_glist))
    {
        /* we need to recreate the buttons */
        (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_ERASE);
        redraw = 1;
    }
    x->x_number = num;
    if(x->x_on >= x->x_number)
    {
        x->x_on_old = x->x_on = x->x_number - 1;
        x->x_on_old = x->x_on;
    }

    if (redraw && gobj_shouldvis((t_gobj *)x, x->x_gui.x_glist))
    {
        (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_NEW);
        canvas_fixlinesfor(x->x_gui.x_glist, (t_text*)x);
    } else {
        /* just reconfigure */
        iemgui_size((void *)x, &x->x_gui);
    }
}